

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_suite.cpp
# Opt level: O0

void api_suite::test_empty(void)

{
  bool bVar1;
  value_type local_c0 [1];
  value_type local_b8 [1];
  undefined1 local_b0 [8];
  infinite<double> filter;
  
  local_b8[0] = 1.0;
  local_c0[0] = 1.0;
  trial::online::impulse::infinite<double>::infinite<1ul,1ul>
            ((infinite<double> *)local_b0,&local_b8,&local_c0,1.0);
  bVar1 = trial::online::impulse::infinite<double>::empty((infinite<double> *)local_b0);
  boost::detail::test_impl
            ("filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,0x1a,"void api_suite::test_empty()",bVar1);
  trial::online::impulse::infinite<double>::push((infinite<double> *)local_b0,1.0);
  bVar1 = trial::online::impulse::infinite<double>::empty((infinite<double> *)local_b0);
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,0x1c,"void api_suite::test_empty()",(bool)(~bVar1 & 1));
  trial::online::impulse::infinite<double>::~infinite((infinite<double> *)local_b0);
  return;
}

Assistant:

void test_empty()
{
    impulse::infinite<double> filter({1.0}, {1.0});
    TRIAL_TEST(filter.empty());
    filter.push(1);
    TRIAL_TEST(!filter.empty());
}